

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_int_&,_const_type_&>::streamReconstructedExpression
          (BinaryExpr<const_int_&,_const_type_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  string asStack_58 [32];
  string local_38;
  
  Detail::stringify<int>(&local_38,this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  std::__cxx11::string::string(asStack_58,(string *)Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)asStack_58;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,lhs,op,in_R9);
  std::__cxx11::string::~string(asStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }